

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  sqlite3 *psVar4;
  ulong uVar5;
  int in_ESI;
  char *pcVar6;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  char c;
  i64 iS;
  int h;
  double s;
  char cf;
  char *zFmt;
  sqlite3 *db;
  size_t j;
  size_t i;
  DateTime y_1;
  DateTime y;
  sqlite3_str sRes;
  DateTime x;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  sqlite3_context *in_stack_fffffffffffffee0;
  DateTime *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  DateTime *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  uchar uVar7;
  ulong local_e0;
  ulong local_d8;
  long local_b8 [5];
  undefined1 local_8f;
  long local_88;
  uint in_stack_ffffffffffffff80;
  undefined1 local_58 [24];
  undefined1 *local_40;
  DateTime local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_38,&DAT_002af5e0,0x30);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  if (((in_ESI != 0) &&
      (puVar3 = sqlite3_value_text((sqlite3_value *)0x22bb84), puVar3 != (uchar *)0x0)) &&
     (iVar1 = isDate((sqlite3_context *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (sqlite3_value **)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                     ,in_stack_fffffffffffffef0), iVar1 == 0)) {
    psVar4 = sqlite3_context_db_handle(in_RDI);
    sqlite3StrAccumInit((StrAccum *)local_58,(sqlite3 *)0x0,(char *)0x0,0,psVar4->aLimit[0]);
    computeJD(in_stack_fffffffffffffef0);
    computeYMD_HMS((DateTime *)0x22bc08);
    local_e0 = 0;
    for (local_d8 = 0; puVar3[local_d8] != '\0'; local_d8 = local_d8 + 1) {
      if (puVar3[local_d8] == '%') {
        if (local_e0 < local_d8) {
          sqlite3_str_append((sqlite3_str *)in_stack_fffffffffffffee0,
                             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0
                            );
        }
        uVar5 = local_d8 + 1;
        local_e0 = local_d8 + 2;
        uVar7 = puVar3[uVar5];
        in_stack_fffffffffffffee0 = (sqlite3_context *)(ulong)((int)(char)uVar7 - 0x25);
        local_d8 = uVar5;
        switch(in_stack_fffffffffffffee0) {
        case (sqlite3_context *)0x0:
          sqlite3_str_appendchar
                    ((sqlite3_str *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                     (char)((uint)in_stack_fffffffffffffed8 >> 0x18));
          break;
        default:
          sqlite3_str_reset((StrAccum *)0x22c2c9);
          goto LAB_0022c321;
        case (sqlite3_context *)0x21:
          sqlite3_str_appendf((StrAccum *)local_58,"%04d-%02d-%02d",(ulong)(uint)local_38.Y,
                              (ulong)(uint)local_38.M,(ulong)(uint)local_38.D);
          break;
        case (sqlite3_context *)0x22:
        case (sqlite3_context *)0x42:
          memcpy(&local_88,&DAT_002af610,0x30);
          memcpy(&local_88,&local_38,0x30);
          iVar1 = daysAfterMonday(&local_38);
          local_88 = (3 - iVar1) * 86400000 + local_88;
          computeYMD(in_stack_ffffffffffffff00);
          if (uVar7 == 'g') {
            sqlite3_str_appendf((StrAccum *)local_58,"%02d",
                                (long)(int)in_stack_ffffffffffffff80 % 100 & 0xffffffff);
          }
          else {
            sqlite3_str_appendf((StrAccum *)local_58,"%04d",(ulong)in_stack_ffffffffffffff80);
          }
          break;
        case (sqlite3_context *)0x23:
        case (sqlite3_context *)0x46:
          pcVar6 = "%2d";
          if (uVar7 == 'H') {
            pcVar6 = "%02d";
          }
          sqlite3_str_appendf((StrAccum *)local_58,pcVar6,(ulong)(uint)local_38.h);
          break;
        case (sqlite3_context *)0x24:
        case (sqlite3_context *)0x47:
          uVar2 = local_38.h;
          if (0xc < local_38.h) {
            uVar2 = local_38.h - 0xc;
          }
          if (uVar2 == 0) {
            uVar2 = 0xc;
          }
          pcVar6 = "%2d";
          if (uVar7 == 'I') {
            pcVar6 = "%02d";
          }
          sqlite3_str_appendf((StrAccum *)local_58,pcVar6,(ulong)uVar2);
          break;
        case (sqlite3_context *)0x25:
          sqlite3_str_appendf((StrAccum *)((double)local_38.iJD / 86400000.0),local_58,"%.16g");
          break;
        case (sqlite3_context *)0x28:
          sqlite3_str_appendf((StrAccum *)local_58,"%02d",(ulong)(uint)local_38.m);
          break;
        case (sqlite3_context *)0x2b:
        case (sqlite3_context *)0x4b:
          if (local_38.h < 0xc) {
            sqlite3_str_append((sqlite3_str *)in_stack_fffffffffffffee0,
                               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                               ,0);
          }
          else {
            sqlite3_str_append((sqlite3_str *)in_stack_fffffffffffffee0,
                               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                               ,0);
          }
          break;
        case (sqlite3_context *)0x2d:
          sqlite3_str_appendf((StrAccum *)local_58,"%02d:%02d",(ulong)(uint)local_38.h,
                              (ulong)(uint)local_38.m);
          break;
        case (sqlite3_context *)0x2e:
          sqlite3_str_appendf((StrAccum *)local_58,"%02d",(ulong)(uint)(int)local_38.s);
          break;
        case (sqlite3_context *)0x2f:
          sqlite3_str_appendf((StrAccum *)local_58,"%02d:%02d:%02d",(ulong)(uint)local_38.h,
                              (ulong)(uint)local_38.m,(ulong)(uint)(int)local_38.s);
          break;
        case (sqlite3_context *)0x30:
          in_stack_fffffffffffffedc =
               daysAfterJan01((DateTime *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          iVar1 = daysAfterSunday(&local_38);
          sqlite3_str_appendf((StrAccum *)local_58,"%02d",
                              (long)((in_stack_fffffffffffffedc - iVar1) + 7) / 7 & 0xffffffff);
          break;
        case (sqlite3_context *)0x31:
          memcpy(local_b8,&DAT_002af640,0x30);
          memcpy(local_b8,&local_38,0x30);
          iVar1 = daysAfterMonday(&local_38);
          local_b8[0] = (3 - iVar1) * 86400000 + local_b8[0];
          local_8f = 0;
          computeYMD(in_stack_ffffffffffffff00);
          iVar1 = daysAfterJan01((DateTime *)
                                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          sqlite3_str_appendf((StrAccum *)local_58,"%02d",(ulong)(iVar1 / 7 + 1));
          break;
        case (sqlite3_context *)0x32:
          in_stack_fffffffffffffed8 =
               daysAfterJan01((DateTime *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          iVar1 = daysAfterMonday(&local_38);
          sqlite3_str_appendf((StrAccum *)local_58,"%02d",
                              (long)((in_stack_fffffffffffffed8 - iVar1) + 7) / 7 & 0xffffffff);
          break;
        case (sqlite3_context *)0x34:
          sqlite3_str_appendf((StrAccum *)local_58,"%04d",(ulong)(uint)local_38.Y);
          break;
        case (sqlite3_context *)0x3f:
        case (sqlite3_context *)0x40:
          pcVar6 = "%2d";
          if (uVar7 == 'd') {
            pcVar6 = "%02d";
          }
          sqlite3_str_appendf((StrAccum *)local_58,pcVar6,(ulong)(uint)local_38.D);
          break;
        case (sqlite3_context *)0x41:
          in_stack_ffffffffffffff00 = (DateTime *)local_38.s;
          if (59.999 < local_38.s) {
            in_stack_ffffffffffffff00 = (DateTime *)0x404dffdf3b645a1d;
          }
          sqlite3_str_appendf((StrAccum *)in_stack_ffffffffffffff00,local_58,"%06.3f");
          break;
        case (sqlite3_context *)0x45:
          iVar1 = daysAfterJan01((DateTime *)
                                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          sqlite3_str_appendf((StrAccum *)local_58,"%03d",(ulong)(iVar1 + 1));
          break;
        case (sqlite3_context *)0x48:
          sqlite3_str_appendf((StrAccum *)local_58,"%02d",(ulong)(uint)local_38.M);
          break;
        case (sqlite3_context *)0x4e:
          if (((byte)local_38._44_1_ >> 2 & 1) == 0) {
            sqlite3_str_appendf((StrAccum *)local_58,"%lld",local_38.iJD / 1000 + -0x3118a36940);
          }
          else {
            sqlite3_str_appendf((StrAccum *)((double)(local_38.iJD + -0xbfc83e532200) / 1000.0),
                                local_58,"%.3f");
          }
          break;
        case (sqlite3_context *)0x50:
        case (sqlite3_context *)0x52:
          daysAfterSunday(&local_38);
          sqlite3_str_appendchar
                    ((sqlite3_str *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                     (char)((uint)in_stack_fffffffffffffed8 >> 0x18));
        }
      }
    }
    if (local_e0 < local_d8) {
      sqlite3_str_append((sqlite3_str *)in_stack_fffffffffffffee0,
                         (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0);
    }
    sqlite3ResultStrAccum
              (in_stack_fffffffffffffee0,
               (StrAccum *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
LAB_0022c321:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    char cf;
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    cf = zFmt[i];
    switch( cf ){
      case 'd':  /* Fall thru */
      case 'e': {
        sqlite3_str_appendf(&sRes, cf=='d' ? "%02d" : "%2d", x.D);
        break;
      }
      case 'f': {  /* Fractional seconds.  (Non-standard) */
        double s = x.s;
        if( NEVER(s>59.999) ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'F': {
        sqlite3_str_appendf(&sRes, "%04d-%02d-%02d", x.Y, x.M, x.D);
        break;
      }
      case 'G': /* Fall thru */
      case 'g': {
        DateTime y = x;
        assert( y.validJD );
        /* Move y so that it is the Thursday in the same week as x */
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        if( cf=='g' ){
          sqlite3_str_appendf(&sRes, "%02d", y.Y%100);
        }else{
          sqlite3_str_appendf(&sRes, "%04d", y.Y);
        }
        break;
      }
      case 'H':
      case 'k': {
        sqlite3_str_appendf(&sRes, cf=='H' ? "%02d" : "%2d", x.h);
        break;
      }
      case 'I': /* Fall thru */
      case 'l': {
        int h = x.h;
        if( h>12 ) h -= 12;
        if( h==0 ) h = 12;
        sqlite3_str_appendf(&sRes, cf=='I' ? "%02d" : "%2d", h);
        break;
      }
      case 'j': {  /* Day of year.  Jan01==1, Jan02==2, and so forth */
        sqlite3_str_appendf(&sRes,"%03d",daysAfterJan01(&x)+1);
        break;
      }
      case 'J': {  /* Julian day number.  (Non-standard) */
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 'p': /* Fall thru */
      case 'P': {
        if( x.h>=12 ){
          sqlite3_str_append(&sRes, cf=='p' ? "PM" : "pm", 2);
        }else{
          sqlite3_str_append(&sRes, cf=='p' ? "AM" : "am", 2);
        }
        break;
      }
      case 'R': {
        sqlite3_str_appendf(&sRes, "%02d:%02d", x.h, x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'T': {
        sqlite3_str_appendf(&sRes,"%02d:%02d:%02d", x.h, x.m, (int)x.s);
        break;
      }
      case 'u':    /* Day of week.  1 to 7.  Monday==1, Sunday==7 */
      case 'w': {  /* Day of week.  0 to 6.  Sunday==0, Monday==1 */
        char c = (char)daysAfterSunday(&x) + '0';
        if( c=='0' && cf=='u' ) c = '7';
        sqlite3_str_appendchar(&sRes, 1, c);
        break;
      }
      case 'U': {  /* Week num. 00-53. First Sun of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
              (daysAfterJan01(&x)-daysAfterSunday(&x)+7)/7);
        break;
      }
      case 'V': {  /* Week num. 01-53. First week with a Thur is week 01 */
        DateTime y = x;
        /* Adjust y so that is the Thursday in the same week as x */
        assert( y.validJD );
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        sqlite3_str_appendf(&sRes,"%02d", daysAfterJan01(&y)/7+1);
        break;
      }
      case 'W': {  /* Week num. 00-53. First Mon of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
           (daysAfterJan01(&x)-daysAfterMonday(&x)+7)/7);
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}